

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldMapTest_Partial_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_Partial_Test *this)

{
  bool bVar1;
  TestDiffMessage_Item *pTVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  FieldDescriptor *field;
  FieldDescriptor *key;
  char *message;
  char *in_R9;
  string local_428;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  undefined1 local_390 [8];
  MessageDifferencer differencer;
  TestDiffMessage msg2;
  Item *item;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldMapTest_Partial_Test *this_local;
  
  msg1.field_0._160_8_ = this;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)&item);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)&item);
  proto2_unittest::TestDiffMessage_Item::set_a(pTVar2,1);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"11",pAVar4);
  proto2_unittest::TestDiffMessage::TestDiffMessage
            ((TestDiffMessage *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item
                     ((TestDiffMessage *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage_Item::set_a(pTVar2,2);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"22",pAVar4);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item
                     ((TestDiffMessage *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage_Item::set_a(pTVar2,1);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"11",pAVar4);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"item",&local_3b1);
  field = GetFieldDescriptor((Message *)&item,&local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"item.a",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  key = GetFieldDescriptor((Message *)&item,&local_3d8);
  util::MessageDifferencer::TreatAsMap((MessageDifferencer *)local_390,field,key);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_390,PARTIAL);
  local_3f1 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_390,(Message *)&item,
                         (Message *)&differencer.unpack_any_field_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_428,(internal *)local_3f0,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x7eb,message);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_390);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)&item);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_Partial) {
  proto2_unittest::TestDiffMessage msg1;
  // message msg1 {
  //   item { a: 1; b: "11" }
  // }
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_a(1);
  item->set_b("11");

  proto2_unittest::TestDiffMessage msg2;
  // message msg2 {
  //   item { a: 2; b: "22" }
  //   item { a: 1; b: "11" }
  // }
  item = msg2.add_item();
  item->set_a(2);
  item->set_b("22");
  item = msg2.add_item();
  item->set_a(1);
  item->set_b("11");

  // Compare
  util::MessageDifferencer differencer;
  differencer.TreatAsMap(GetFieldDescriptor(msg1, "item"),
                         GetFieldDescriptor(msg1, "item.a"));
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}